

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<const_kj::FsNode> __thiscall
kj::anon_unknown_8::DiskReadableFile::cloneFsNode(DiskReadableFile *this)

{
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode> OVar1;
  AutoCloseFd local_30;
  Own<kj::(anonymous_namespace)::DiskReadableFile> local_28;
  DiskReadableFile *this_local;
  
  this_local = this;
  DiskHandle::clone((DiskHandle *)&local_30,(__fn *)(in_RSI + 8),in_RDX,in_ECX,in_R8);
  heap<kj::(anonymous_namespace)::DiskReadableFile,kj::AutoCloseFd>((kj *)&local_28,&local_30);
  Own<kj::FsNode_const>::Own<kj::(anonymous_namespace)::DiskReadableFile,void>
            ((Own<kj::FsNode_const> *)this,&local_28);
  Own<kj::(anonymous_namespace)::DiskReadableFile>::~Own(&local_28);
  AutoCloseFd::~AutoCloseFd(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

size_t read(uint64_t offset, ArrayPtr<byte> buffer) const override {
    return DiskHandle::read(offset, buffer);
  }